

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O0

HRESULT __thiscall Js::SourceTextModuleRecord::PostParseProcess(SourceTextModuleRecord *this)

{
  undefined4 local_14;
  HRESULT hr;
  SourceTextModuleRecord *this_local;
  
  SetWasParsed(this);
  ImportModuleListsFromParser(this);
  local_14 = ResolveExternalModuleDependencies(this);
  if (local_14 < 0) {
    ReleaseParserResourcesForHierarchy(this);
  }
  else {
    local_14 = PrepareForModuleDeclarationInitialization(this);
  }
  return local_14;
}

Assistant:

HRESULT SourceTextModuleRecord::PostParseProcess()
    {
        HRESULT hr = NOERROR;
        SetWasParsed();
        ImportModuleListsFromParser();
        hr = ResolveExternalModuleDependencies();

        if (SUCCEEDED(hr))
        {
            hr = PrepareForModuleDeclarationInitialization();
        }
        else
        {
            // Cleanup in case of error.
            this->ReleaseParserResourcesForHierarchy();
        }

        return hr;
    }